

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

QpVector * __thiscall MatrixBase::extractcol(MatrixBase *this,HighsInt col,QpVector *target)

{
  value_type vVar1;
  int iVar2;
  value_type vVar3;
  reference pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  vector<double,_std::allocator<double>_> *this_00;
  const_reference pvVar7;
  QpVector *in_RDX;
  int in_ESI;
  long in_RDI;
  HighsInt i;
  QpVector *in_stack_ffffffffffffffb0;
  int local_1c;
  
  QpVector::reset(in_stack_ffffffffffffffb0);
  if (in_ESI < *(int *)(in_RDI + 4)) {
    local_1c = 0;
    while( true ) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)(in_ESI + 1));
      iVar2 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)in_ESI);
      if (iVar2 - *pvVar6 <= local_1c) break;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)in_ESI);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),
                          (long)(*pvVar6 + local_1c));
      vVar3 = *pvVar6;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDX->index,(long)local_1c);
      *pvVar4 = vVar3;
      this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x38);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)in_ESI);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (this_00,(long)(*pvVar6 + local_1c));
      vVar1 = *pvVar7;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDX->index,(long)local_1c);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDX->value,(long)*pvVar4);
      *pvVar5 = vVar1;
      local_1c = local_1c + 1;
    }
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)(in_ESI + 1));
    iVar2 = *pvVar6;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)in_ESI);
    in_RDX->num_nz = iVar2 - *pvVar6;
  }
  else {
    iVar2 = *(int *)(in_RDI + 4);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDX->index,0);
    *pvVar4 = in_ESI - iVar2;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDX->value,(long)(in_ESI - *(int *)(in_RDI + 4)));
    *pvVar5 = 1.0;
    in_RDX->num_nz = 1;
  }
  return in_RDX;
}

Assistant:

QpVector& extractcol(HighsInt col, QpVector& target) const {
    assert(target.dim == num_row);
    target.reset();

    if (col >= num_col) {
      target.index[0] = col - num_col;
      target.value[col - num_col] = 1.0;
      target.num_nz = 1;
    } else {
      for (HighsInt i = 0; i < start[col + 1] - start[col]; i++) {
        target.index[i] = index[start[col] + i];
        target.value[target.index[i]] = value[start[col] + i];
      }
      target.num_nz = start[col + 1] - start[col];
    }

    return target;
  }